

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

void IpmiFillPICMGHeader(uint8_t picmg_record_id,size_t size)

{
  size_t size_local;
  uint8_t picmg_record_id_local;
  
  multirecord.header.common_header.type_id = 0xc0;
  multirecord.header.common_header.format_version = '\x02';
  multirecord.header.common_header.length = (char)size + '\x05';
  multirecord.header.common_header.record_checksum = '\0';
  multirecord.header.common_header.header_checksum = '\0';
  multirecord.header.manufacturer_id[0] = 'Z';
  multirecord.header.manufacturer_id[1] = '1';
  multirecord.header.manufacturer_id[2] = '\0';
  multirecord.header.picmg_record_id = picmg_record_id;
  multirecord.header.picmg_format_version = '\0';
  return;
}

Assistant:

void IpmiFillPICMGHeader(uint8_t picmg_record_id, size_t size)
{
    multirecord.header.common_header.type_id = IPMI_FRUINFO_MULTIRECORD_OEM_TYPE_ID;
    multirecord.header.common_header.format_version = IPMI_FRUINFO_MULTIRECORD_FORMAT_VERSION;
    multirecord.header.common_header.length = size + 
        sizeof(ipmi_fru_picmg_record_header_t) - 
        sizeof(ipmi_fru_multirecord_record_header_t);
    multirecord.header.common_header.header_checksum = 
        multirecord.header.common_header.record_checksum = 0;
    multirecord.header.manufacturer_id[0] = 0x5A;
    multirecord.header.manufacturer_id[1] = 0x31;
    multirecord.header.manufacturer_id[2] = 0;
    multirecord.header.picmg_record_id = picmg_record_id;
    multirecord.header.picmg_format_version = 0;
}